

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

int mwRelink(mwData *mw,char *file,int line)

{
  mwData *pmVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  mwStat *pmVar5;
  long lVar6;
  mwData **ppmVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  mwData *pmVar14;
  long lVar15;
  mwData *pmVar16;
  
  uVar8 = (ulong)(uint)line;
  pcVar12 = "unknown";
  if (file != (char *)0x0) {
    pcVar12 = file;
  }
  uVar9 = 0x38;
  if (mw == (mwData *)0x0) {
    mwWrite("relink: cannot repair MW at NULL\n");
LAB_0010862c:
    mwFlush();
    if (mwTail == (mwData *)0x0 && mwHead == (mwData *)0x0) {
      pcVar11 = "relink: <%ld> %s(%d) heap damaged beyond repair\n";
      if (mwStatCurAlloc == 0) {
        pcVar11 = "relink: <%ld> %s(%d) heap is empty, nothing to repair\n";
      }
      mwWrite(pcVar11,mwCounter,pcVar12,uVar8);
      mwFlush();
      return 0;
    }
    mwWrite("relink: <%ld> %s(%d) attempting emergency repairs...\n",mwCounter,pcVar12,uVar8);
    mwFlush();
    if (mwTail == (mwData *)0x0 || mwHead == (mwData *)0x0) {
      if (mwHead == (mwData *)0x0) {
        pcVar12 = "relink: mwHead is NULL, but mwTail is %p\n";
        pmVar14 = mwTail;
      }
      else {
        pcVar12 = "relink: mwTail is NULL, but mwHead is %p\n";
        pmVar14 = mwHead;
      }
      mwWrite(pcVar12,pmVar14);
      if (mwHead != (mwData *)0x0) goto LAB_001086ee;
LAB_001087dd:
      pmVar14 = (mwData *)0x0;
    }
    else {
LAB_001086ee:
      uVar10 = 0;
      if (mwDataSize != '\0') {
        uVar10 = uVar9;
      }
      iVar4 = mwIsReadAddr(mwHead,uVar10);
      if ((iVar4 == 0) ||
         ((mwHead->count ^ mwHead->check ^ mwHead->size ^ (long)mwHead->line) != 0xfe0180)) {
        pmVar14 = (mwData *)0x0;
        mwWrite("relink: mwHead (MW-%p) is damaged, skipping forward scan\n");
        mwHead = (mwData *)0x0;
      }
      else {
        pmVar16 = mwHead;
        if (mwHead->prev != (mwData *)0x0) {
          mwWrite("relink: the mwHead pointer\'s \'prev\' member is %p, not NULL\n",mwHead->prev);
          pmVar16 = mwHead;
        }
        while( true ) {
          do {
            pmVar14 = pmVar16;
            if (pmVar14 == (mwData *)0x0) goto LAB_001087dd;
            pmVar16 = (mwData *)0x0;
          } while (pmVar14->next == (mwData *)0x0);
          uVar10 = 0;
          if (mwDataSize != '\0') {
            uVar10 = 0x38;
          }
          iVar4 = mwIsReadAddr(pmVar14->next,uVar10);
          if (iVar4 == 0) break;
          pmVar16 = pmVar14->next;
          uVar8 = pmVar14->size;
          uVar13 = (ulong)pmVar14->line;
          if (((uVar13 ^ uVar8 ^ (ulong)(pmVar16->check == 0) ^ pmVar14->count) != 0xfe0180) ||
             (pmVar16->prev != pmVar14)) goto LAB_00108b03;
        }
        uVar8 = pmVar14->size;
        uVar13 = (ulong)(uint)pmVar14->line;
LAB_00108b03:
        pcVar11 = "NoMansLand ";
        pcVar12 = "NoMansLand ";
        if ((mw->flag & 1) == 0) {
          pcVar12 = "";
        }
        mwWrite("relink: forward chain\'s last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",pmVar14,
                uVar8,pcVar12,pmVar14->file,uVar13);
        uVar10 = 0;
        if (mwDataSize != '\0') {
          uVar10 = uVar9;
        }
        iVar4 = mwIsReadAddr(pmVar14->next,uVar10);
        if (iVar4 == 0) {
          mwWrite("relink: the \'next\' pointer of this MW points to %p, which is out-of-legal-access\n"
                  ,pmVar14->next);
        }
        else {
          pmVar16 = pmVar14->next;
          sVar2 = pmVar14->size;
          if ((mw->flag & 1) == 0) {
            pcVar11 = "";
          }
          iVar4 = mwIsReadAddr(pmVar14->file,0x10);
          if (iVar4 == 0) {
            pcVar12 = "<garbage-pointer>";
          }
          else {
            pcVar12 = pmVar14->file;
          }
          mwWrite("relink: forward chain\'s first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
                  pmVar16,sVar2,pcVar11,pcVar12,(ulong)(uint)pmVar14->line);
        }
      }
    }
    pmVar16 = (mwData *)0x0;
    if (mwTail != (mwData *)0x0) {
      uVar10 = 0;
      if (mwDataSize != '\0') {
        uVar10 = uVar9;
      }
      iVar4 = mwIsReadAddr(mwTail,uVar10);
      if ((iVar4 == 0) ||
         ((mwTail->count ^ mwTail->check ^ mwTail->size ^ (long)mwTail->line) != 0xfe0180)) {
        pmVar16 = (mwData *)0x0;
        mwWrite("relink: mwTail (%p) is damaged, skipping reverse scan\n");
        mwTail = (mwData *)0x0;
      }
      else {
        pmVar1 = mwTail;
        if (mwTail->next != (mwData *)0x0) {
          mwWrite("relink: the mwTail pointer\'s \'next\' member is %p, not NULL\n",mwTail->next);
          pmVar1 = mwTail;
        }
        while( true ) {
          do {
            pmVar16 = pmVar1;
            if (pmVar16 == (mwData *)0x0) {
              pmVar16 = (mwData *)0x0;
              goto LAB_001088dd;
            }
            pmVar1 = (mwData *)0x0;
          } while (pmVar16->prev == (mwData *)0x0);
          uVar9 = 0;
          if (mwDataSize != '\0') {
            uVar9 = 0x38;
          }
          iVar4 = mwIsReadAddr(pmVar16->prev,uVar9);
          if (iVar4 == 0) break;
          pmVar1 = pmVar16->prev;
          uVar8 = pmVar16->size;
          uVar13 = (ulong)pmVar16->line;
          if (((uVar13 ^ uVar8 ^ (ulong)(pmVar1->check == 0) ^ pmVar16->count) != 0xfe0180) ||
             (pmVar1->next != pmVar16)) goto LAB_00108b9e;
        }
        uVar8 = pmVar16->size;
        uVar13 = (ulong)(uint)pmVar16->line;
LAB_00108b9e:
        pcVar11 = "NoMansLand ";
        pcVar12 = "NoMansLand ";
        if ((mw->flag & 1) == 0) {
          pcVar12 = "";
        }
        mwWrite("relink: reverse chain\'s last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",pmVar16,
                uVar8,pcVar12,pmVar16->file,uVar13);
        uVar9 = 0x38;
        if (mwDataSize == '\0') {
          uVar9 = 0;
        }
        iVar4 = mwIsReadAddr(pmVar16->prev,uVar9);
        if (iVar4 == 0) {
          mwWrite("relink: the \'prev\' pointer of this MW points to %p, which is out-of-legal-access\n"
                  ,pmVar16->prev);
        }
        else {
          pmVar1 = pmVar16->prev;
          sVar2 = pmVar16->size;
          if ((mw->flag & 1) == 0) {
            pcVar11 = "";
          }
          iVar4 = mwIsReadAddr(pmVar16->file,0x10);
          if (iVar4 == 0) {
            pcVar12 = "<garbage-pointer>";
          }
          else {
            pcVar12 = pmVar16->file;
          }
          mwWrite("relink: reverse chain\'s first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
                  pmVar1,sVar2,pcVar11,pcVar12,(ulong)(uint)pmVar16->line);
        }
      }
    }
LAB_001088dd:
    if (mwHead == (mwData *)0x0 && mwTail == (mwData *)0x0) {
      pcVar12 = "relink: both head and tail pointers damaged, aborting program\n";
      goto LAB_00108c91;
    }
    if (mwHead == (mwData *)0x0) {
      pmVar14 = (mwData *)0x0;
      mwHead = pmVar16;
      mwWrite("relink: heap truncated, MW-%p designated as new mwHead\n",pmVar16);
      pmVar16->prev = (mwData *)0x0;
      pmVar16 = (mwData *)0x0;
    }
    if (mwTail == (mwData *)0x0) {
      pmVar16 = (mwData *)0x0;
      mwTail = pmVar14;
      mwWrite("relink: heap truncated, MW-%p designated as new mwTail\n",pmVar14);
      pmVar14->next = (mwData *)0x0;
      pmVar14 = (mwData *)0x0;
    }
    if (pmVar14 == (mwData *)0x0 && pmVar16 == (mwData *)0x0) {
      if ((mwHead->prev != (mwData *)0x0) || (mwTail->next != (mwData *)0x0)) {
LAB_00108c78:
        pcVar12 = "relink: heap totally destroyed, aborting program\n";
        goto LAB_00108c91;
      }
      pcVar12 = "relink: verifying heap integrity...\n";
    }
    else {
      if (((pmVar16 == (mwData *)0x0) || (pmVar14 == pmVar16)) || (pmVar14 == (mwData *)0x0))
      goto LAB_00108c78;
      pmVar14->next = pmVar16;
      pmVar16->prev = pmVar14;
      pcVar12 = "relink: emergency repairs successful, assessing damage...\n";
    }
    mwWrite(pcVar12);
LAB_001089b1:
    mwFlush();
  }
  else {
    uVar10 = 0;
    if (mwDataSize != '\0') {
      uVar10 = 0x38;
    }
    iVar4 = mwIsSafeAddr(mw,uVar10);
    if (iVar4 == 0) {
      pcVar11 = "relink: MW-%p is a garbage pointer\n";
LAB_00108622:
      mwWrite(pcVar11,mw);
      goto LAB_0010862c;
    }
    uVar10 = 0;
    mwWrite("relink: <%ld> %s(%d) attempting to repair MW-%p...\n",mwCounter,pcVar12,uVar8,mw);
    mwFlush();
    if (mwHead != mw) {
      if (mwDataSize != '\0') {
        uVar10 = 0x38;
      }
      iVar4 = mwIsSafeAddr(mwHead,uVar10);
      pmVar14 = mwHead;
      if (iVar4 == 0) {
        pcVar11 = "relink: failed for MW-%p; head pointer destroyed\n";
        goto LAB_00108622;
      }
      do {
        do {
          pmVar16 = pmVar14;
          if (pmVar16 == (mwData *)0x0) {
            mwWrite("relink: MW-%p not found in forward chain search\n");
            mwFlush();
            bVar3 = true;
            goto LAB_0010855e;
          }
          pmVar1 = pmVar16->next;
          if (pmVar1 == mw) {
            mw->prev = pmVar16;
            bVar3 = false;
            goto LAB_0010855e;
          }
          pmVar14 = (mwData *)0x0;
        } while (pmVar1 == (mwData *)0x0);
        uVar10 = 0;
        if (mwDataSize != '\0') {
          uVar10 = 0x38;
        }
        iVar4 = mwIsSafeAddr(pmVar1,uVar10);
      } while ((iVar4 != 0) && (pmVar14 = pmVar16->next, pmVar16->next->prev == pmVar16));
      pcVar11 = "relink: failed for MW-%p; forward chain fragmented at MW-%p: \'next\' is %p\n";
LAB_001085d5:
      mwWrite(pcVar11,mw,pmVar16);
      goto LAB_0010862c;
    }
    bVar3 = false;
    mwWrite("relink: MW-%p is the head (first) allocation\n");
    if (mw->prev != (mwData *)0x0) {
      bVar3 = false;
      mwWrite("relink: MW-%p prev pointer is non-NULL, you have a wild pointer\n");
      mw->prev = (mwData *)0x0;
    }
LAB_0010855e:
    if (mwTail != mw) {
      uVar10 = 0;
      if (mwDataSize != '\0') {
        uVar10 = 0x38;
      }
      iVar4 = mwIsSafeAddr(mwTail,uVar10);
      pmVar14 = mwTail;
      if (iVar4 == 0) {
        pcVar11 = "relink: failed for MW-%p; tail pointer destroyed\n";
        goto LAB_00108622;
      }
      do {
        do {
          pmVar16 = pmVar14;
          if (pmVar16 == (mwData *)0x0) {
            mwWrite("relink: MW-%p not found in reverse chain search\n",mw);
            mwFlush();
            if (!bVar3) goto LAB_001089f5;
            mwWrite("relink: heap appears intact, MW-%p probably garbage pointer\n",mw);
            goto LAB_001089b1;
          }
          pmVar1 = pmVar16->prev;
          if (pmVar1 == mw) {
            mw->next = pmVar16;
            goto LAB_001089f5;
          }
          pmVar14 = (mwData *)0x0;
        } while (pmVar1 == (mwData *)0x0);
        uVar10 = 0;
        if (mwDataSize != '\0') {
          uVar10 = 0x38;
        }
        iVar4 = mwIsSafeAddr(pmVar1,uVar10);
      } while ((iVar4 != 0) && (pmVar14 = pmVar16->prev, pmVar16->prev->next == pmVar16));
      pcVar11 = "relink: failed for MW-%p; reverse chain fragmented at MW-%p, \'prev\' is %p\n";
      goto LAB_001085d5;
    }
    mwWrite("relink: MW-%p is the tail (last) allocation\n",mw);
    if (mw->next != (mwData *)0x0) {
      mwWrite("relink: MW-%p next pointer is non-NULL, you have a wild pointer\n",mw);
      mw->next = (mwData *)0x0;
    }
LAB_001089f5:
    iVar4 = mwIsReadAddr(mw->file,1);
    if ((iVar4 != 0) && (pmVar5 = mwStatGet(mw->file,-1,0), pmVar5 == (mwStat *)0x0)) {
      mw->file = "<relinked>";
    }
    mw->check = mw->count ^ mw->size ^ (long)mw->line ^ 0xfe0180;
  }
  iVar4 = mwIsHeapOK((mwData *)0x0);
  if (iVar4 != 0) {
    iVar4 = 1;
    lVar6 = 0;
    lVar15 = 0;
    ppmVar7 = &mwHead;
    while (pmVar14 = *ppmVar7, pmVar14 != (mwData *)0x0) {
      lVar6 = lVar6 + 1;
      lVar15 = lVar15 + pmVar14->size;
      ppmVar7 = &pmVar14->next;
    }
    if (mwNumCurAlloc == lVar6) {
      mwWrite("relink: successful, ");
      if (lVar15 == mwStatCurAlloc) {
        mwWrite("no allocations lost\n");
      }
      else if (mw != (mwData *)0x0) {
        mwWrite("size information lost for MW-%p\n",mw);
        mw->size = 0;
      }
    }
    else {
      iVar4 = 0;
      mwWrite("relink: partial, %ld MW-blocks of %ld bytes lost\n",
              (mwNumCurAlloc + mwNmlNumAlloc) - lVar6,(mwNmlCurAlloc - lVar15) + mwStatCurAlloc);
    }
    return iVar4;
  }
  pcVar12 = "relink: heap verification FAILS - aborting program\n";
LAB_00108c91:
  mwWrite(pcVar12);
  mwFlushingB2 = 1;
  mwFlushingB1 = mwFlushingB2;
  mwFlushing = mwFlushingB2;
  mwFlush();
  abort();
}

Assistant:

static int mwRelink(mwData *mw, const char *file, int line)
{
	int fails;
	mwData *mw1, *mw2;
	long count, size;
	mwStat *ms;

	if (file == NULL) {
		file = "unknown";
	}

	if (mw == NULL) {
		mwWrite("relink: cannot repair MW at NULL\n");
		FLUSH();
		goto emergency;
	}

	if (!mwIsSafeAddr(mw, mwDataSize)) {
		mwWrite("relink: MW-%p is a garbage pointer\n", mw);
		FLUSH();
		goto emergency;
	}

	mwWrite("relink: <%ld> %s(%d) attempting to repair MW-%p...\n", mwCounter, file, line, mw);
	FLUSH();
	fails = 0;

	/* Repair from head */
	if (mwHead != mw) {
		if (!mwIsSafeAddr(mwHead, mwDataSize)) {
			mwWrite("relink: failed for MW-%p; head pointer destroyed\n", mw);
			FLUSH();
			goto emergency;
		}
		for (mw1 = mwHead; mw1; mw1 = mw1->next) {
			if (mw1->next == mw) {
				mw->prev = mw1;
				break;
			}
			if (mw1->next &&
				(!mwIsSafeAddr(mw1->next, mwDataSize) || mw1->next->prev != mw1)) {
				mwWrite("relink: failed for MW-%p; forward chain fragmented at MW-%p: 'next' is %p\n", mw, mw1, mw1->next);
				FLUSH();
				goto emergency;
			}
		}
		if (mw1 == NULL) {
			mwWrite("relink: MW-%p not found in forward chain search\n", mw);
			FLUSH();
			fails ++;
		}
	} else {
		mwWrite("relink: MW-%p is the head (first) allocation\n", mw);
		if (mw->prev != NULL) {
			mwWrite("relink: MW-%p prev pointer is non-NULL, you have a wild pointer\n", mw);
			mw->prev = NULL;
		}
	}

	/* Repair from tail */
	if (mwTail != mw) {
		if (!mwIsSafeAddr(mwTail, mwDataSize)) {
			mwWrite("relink: failed for MW-%p; tail pointer destroyed\n", mw);
			FLUSH();
			goto emergency;
		}
		for (mw1 = mwTail; mw1; mw1 = mw1->prev) {
			if (mw1->prev == mw) {
				mw->next = mw1;
				break;
			}
			if (mw1->prev && (!mwIsSafeAddr(mw1->prev, mwDataSize) || mw1->prev->next != mw1)) {
				mwWrite("relink: failed for MW-%p; reverse chain fragmented at MW-%p, 'prev' is %p\n", mw, mw1, mw1->prev);
				FLUSH();
				goto emergency;
			}
		}
		if (mw1 == NULL) {
			mwWrite("relink: MW-%p not found in reverse chain search\n", mw);
			FLUSH();
			fails ++;
		}
	} else {
		mwWrite("relink: MW-%p is the tail (last) allocation\n", mw);
		if (mw->next != NULL) {
			mwWrite("relink: MW-%p next pointer is non-NULL, you have a wild pointer\n", mw);
			mw->next = NULL;
		}
	}

	if (fails > 1) {
		mwWrite("relink: heap appears intact, MW-%p probably garbage pointer\n", mw);
		FLUSH();
		goto verifyok;
	}

	/* restore MW info where possible */
	if (mwIsReadAddr(mw->file, 1)) {
		ms = mwStatGet(mw->file, -1, 0);
		if (ms == NULL) {
			mw->file = "<relinked>";
		}
	}
	mw->check = CHKVAL(mw);
	goto verifyok;

	/* Emergency repair */
emergency:

	if (mwHead == NULL && mwTail == NULL) {
		if (mwStatCurAlloc == 0) {
			mwWrite("relink: <%ld> %s(%d) heap is empty, nothing to repair\n", mwCounter, file, line);
		} else {
			mwWrite("relink: <%ld> %s(%d) heap damaged beyond repair\n", mwCounter, file, line);
		}
		FLUSH();
		return 0;
	}

	mwWrite("relink: <%ld> %s(%d) attempting emergency repairs...\n", mwCounter, file, line);
	FLUSH();

	if (mwHead == NULL || mwTail == NULL) {
		if (mwHead == NULL) {
			mwWrite("relink: mwHead is NULL, but mwTail is %p\n", mwTail);
		} else {
			mwWrite("relink: mwTail is NULL, but mwHead is %p\n", mwHead);
		}
	}

	mw1 = NULL;
	if (mwHead != NULL) {
		if (!mwIsReadAddr(mwHead, mwDataSize) || mwHead->check != CHKVAL(mwHead)) {
			mwWrite("relink: mwHead (MW-%p) is damaged, skipping forward scan\n", mwHead);
			mwHead = NULL;
			goto scan_reverse;
		}
		if (mwHead->prev != NULL) {
			mwWrite("relink: the mwHead pointer's 'prev' member is %p, not NULL\n", mwHead->prev);
		}
		for (mw1 = mwHead; mw1; mw1 = mw1->next) {
			if (mw1->next) {
				if (!mwIsReadAddr(mw1->next, mwDataSize) ||
					(!mw1->next->check) != CHKVAL(mw1) ||
					mw1->next->prev != mw1) {
					mwWrite("relink: forward chain's last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",
							mw1, mw1->size, (mw->flag & MW_NML) ? "NoMansLand " : "", mw1->file, mw1->line);
					if (mwIsReadAddr(mw1->next, mwDataSize)) {
						mwWrite("relink: forward chain's first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
								mw1->next, mw1->size, (mw->flag & MW_NML) ? "NoMansLand " : "",
								mwIsReadAddr(mw1->file, 16) ? mw1->file : "<garbage-pointer>", mw1->line);
					} else {
						mwWrite("relink: the 'next' pointer of this MW points to %p, which is out-of-legal-access\n",
								mw1->next);
					}
					break;
				}
			}
		}
	}


scan_reverse:
	mw2 = NULL;
	if (mwTail != NULL) {
		if (!mwIsReadAddr(mwTail, mwDataSize) || mwTail->check != CHKVAL(mwTail)) {
			mwWrite("relink: mwTail (%p) is damaged, skipping reverse scan\n", mwTail);
			mwTail = NULL;
			goto analyze;
		}
		if (mwTail->next != NULL) {
			mwWrite("relink: the mwTail pointer's 'next' member is %p, not NULL\n", mwTail->next);
		}
		for (mw2 = mwTail; mw2; mw2 = mw2->prev) {
			if (mw2->prev) {
				if (!mwIsReadAddr(mw2->prev, mwDataSize) ||
					(!mw2->prev->check) != CHKVAL(mw2) ||
					mw2->prev->next != mw2) {
					mwWrite("relink: reverse chain's last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",
							mw2, mw2->size, (mw->flag & MW_NML) ? "NoMansLand " : "", mw2->file, mw2->line);
					if (mwIsReadAddr(mw2->prev, mwDataSize)) {
						mwWrite("relink: reverse chain's first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
								mw2->prev, mw2->size, (mw->flag & MW_NML) ? "NoMansLand " : "",
								mwIsReadAddr(mw2->file, 16) ? mw2->file : "<garbage-pointer>", mw2->line);
					} else {
						mwWrite("relink: the 'prev' pointer of this MW points to %p, which is out-of-legal-access\n",
								mw2->prev);
					}
					break;
				}
			}
		}
	}

analyze:
	if (mwHead == NULL && mwTail == NULL) {
		mwWrite("relink: both head and tail pointers damaged, aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}
	if (mwHead == NULL) {
		mwHead = mw2;
		mwWrite("relink: heap truncated, MW-%p designated as new mwHead\n", mw2);
		mw2->prev = NULL;
		mw1 = mw2 = NULL;
	}
	if (mwTail == NULL) {
		mwTail = mw1;
		mwWrite("relink: heap truncated, MW-%p designated as new mwTail\n", mw1);
		mw1->next = NULL;
		mw1 = mw2 = NULL;
	}
	if (mw1 == NULL && mw2 == NULL &&
		mwHead->prev == NULL && mwTail->next == NULL) {
		mwWrite("relink: verifying heap integrity...\n");
		FLUSH();
		goto verifyok;
	}
	if (mw1 && mw2 && mw1 != mw2) {
		mw1->next = mw2;
		mw2->prev = mw1;
		mwWrite("relink: emergency repairs successful, assessing damage...\n");
		FLUSH();
	} else {
		mwWrite("relink: heap totally destroyed, aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}

	/* Verify by checking that the number of active allocations */
	/* match the number of entries in the chain */
verifyok:
	if (!mwIsHeapOK(NULL)) {
		mwWrite("relink: heap verification FAILS - aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}
	for (size = count = 0, mw1 = mwHead; mw1; mw1 = mw1->next) {
		count ++;
		size += (long) mw1->size;
	}
	if (count == mwNumCurAlloc) {
		mwWrite("relink: successful, ");
		if (size == mwStatCurAlloc) {
			mwWrite("no allocations lost\n");
		} else {
			if (mw != NULL) {
				mwWrite("size information lost for MW-%p\n", mw);
				mw->size = 0;
			}
		}
	} else {
		mwWrite("relink: partial, %ld MW-blocks of %ld bytes lost\n",
				mwNmlNumAlloc + mwNumCurAlloc - count, mwNmlCurAlloc + mwStatCurAlloc - size);
		return 0;
	}

	return 1;
}